

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
ComparisonFailure::ComparisonFailure
          (ComparisonFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *checkString,SimpleString *comparisonString,SimpleString *text)

{
  size_t in_RDX;
  SimpleString *in_RSI;
  TestFailure *in_RDI;
  SimpleString *in_R9;
  TestFailure *unaff_retaddr;
  SimpleString *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc8;
  TestFailure *this_00;
  
  this_00 = in_RDI;
  TestFailure::TestFailure(unaff_retaddr,(UtestShell *)in_RDI,(char *)in_RSI,in_RDX);
  in_RDI->_vptr_TestFailure = (_func_int **)&PTR__ComparisonFailure_001c3938;
  TestFailure::createUserText(this_00,in_RSI);
  SimpleString::operator=(in_stack_ffffffffffffffb0,(SimpleString *)in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17a0d1);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,(SimpleString *)in_RDI);
  SimpleString::operator+=(in_R9,in_stack_ffffffffffffffc8);
  SimpleString::operator+=(in_stack_ffffffffffffffb0,(SimpleString *)in_RDI);
  SimpleString::operator+=(in_R9,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

ComparisonFailure::ComparisonFailure(UtestShell *test, const char *fileName, size_t lineNumber, const SimpleString& checkString, const SimpleString &comparisonString, const SimpleString &text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);
    message_ += checkString;
    message_ += "(";
    message_ += comparisonString;
    message_ += ") failed";
}